

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O2

int convolution_segment_set_out
              (uint32_t field,uint32_t location,void *buffer,mixed_segment *segment)

{
  int code;
  
  if (field == 0) {
    if (location == 0) {
      *(void **)((long)segment->data + 8) = buffer;
      return 1;
    }
    code = 6;
  }
  else {
    code = 7;
  }
  mixed_err(code);
  return 0;
}

Assistant:

int convolution_segment_set_out(uint32_t field, uint32_t location, void *buffer, struct mixed_segment *segment){
  struct convolution_segment_data *data = (struct convolution_segment_data *)segment->data;

  switch(field){
  case MIXED_BUFFER:
    if(location == 0){
      data->out = (struct mixed_buffer *)buffer;
      return 1;
    }
    mixed_err(MIXED_INVALID_LOCATION);
    return 0;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}